

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::FileTimeGet(char *fname,cmSystemToolsFileTime *t)

{
  int iVar1;
  stat st;
  stat64 sStack_98;
  
  iVar1 = stat64(fname,&sStack_98);
  if (-1 < iVar1) {
    (t->timeBuf).actime = sStack_98.st_atim.tv_sec;
    (t->timeBuf).modtime = sStack_98.st_mtim.tv_sec;
  }
  return -1 < iVar1;
}

Assistant:

bool cmSystemTools::FileTimeGet(const char* fname, cmSystemToolsFileTime* t)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle h = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(fname).c_str(), GENERIC_READ,
    FILE_SHARE_READ, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return false;
  }
  if (!GetFileTime(h, &t->timeCreation, &t->timeLastAccess,
                   &t->timeLastWrite)) {
    return false;
  }
#else
  struct stat st;
  if (stat(fname, &st) < 0) {
    return false;
  }
  t->timeBuf.actime = st.st_atime;
  t->timeBuf.modtime = st.st_mtime;
#endif
  return true;
}